

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Glucose::Clause::Clause<Glucose::Clause>(Clause *this,Clause *ps,int _extra_size,bool learnt)

{
  ulong uVar1;
  int iVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar3 = (_extra_size & 3U) * 0x10;
  uVar5 = (ulong)(uVar3 + (int)CONCAT71(in_register_00000009,learnt) * 4) |
          *(ulong *)&this->header & 0xffffffffffffff48;
  *(ulong *)&this->header = uVar5;
  uVar1 = *(ulong *)&ps->header;
  *(ulong *)&this->header = (ulong)((uint)uVar5 & 0x80000034) + (uVar1 & 0xffffffff00000000) + 8;
  if (0 < *(int *)&(ps->header).field_0x4) {
    lVar6 = 0;
    do {
      *(undefined4 *)(&this[1].header.field_0x0 + lVar6 * 4) =
           *(undefined4 *)(&ps[1].header.field_0x0 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)&(ps->header).field_0x4);
  }
  if ((_extra_size & 3U) != 0) {
    iVar2 = (int)(uVar1 >> 0x20);
    if (learnt) {
      *(undefined4 *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = 0;
    }
    else {
      if (iVar2 < 1) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 | 1 << ((byte)(&this[1].header.field_0x0)[uVar5 * 4] >> 1 & 0x1f);
          uVar5 = uVar5 + 1;
        } while (uVar1 >> 0x20 != uVar5);
      }
      *(uint *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = uVar4;
    }
    if (0x1f < uVar3) {
      *(undefined4 *)(&this[1].header.field_0x0 + (ulong)(iVar2 + 1) * 4) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V& ps, int _extra_size, bool learnt) {
	assert(_extra_size < (1<<2));
        header.mark      = 0;
        header.learnt    = learnt;
        header.extra_size = _extra_size;
            header.reloced   = 0;
        header.size      = ps.size();
	header.lbd = 0;
	header.canbedel = 1;
	header.exported = 0; 
	header.oneWatched = 0;
	header.seen = 0;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
	
        if (header.extra_size > 0){
	  if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction();
	  if (header.extra_size > 1) {
	      data[header.size+1].abs = 0; // learntFrom
	  }	      
	}
    }